

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

void __thiscall
phpconvert::ZendParser::buildFiles
          (ZendParser *this,File *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpOut,int *processed,
          vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
          *readerResult,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tmpOutPairs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVector)

{
  bool bVar1;
  pointer pIVar2;
  long lVar3;
  reference item;
  reference pPVar4;
  undefined1 local_3c8 [8];
  PreparedType type_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *__range2_1;
  PreparedType type;
  iterator __end2;
  iterator __begin2;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *__range2;
  File local_188;
  __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
  local_50;
  Item *local_48;
  __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
  local_40;
  iterator it;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tmpOutPairs_local;
  vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
  *readerResult_local;
  int *processed_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmpOut_local;
  File *file_local;
  ZendParser *this_local;
  
  it._M_current = (Item *)tmpOutPairs;
  __gnu_cxx::
  __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
  ::__normal_iterator(&local_40);
  local_48 = (Item *)std::
                     vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
                     ::begin(readerResult);
  local_40._M_current = local_48;
  while( true ) {
    local_50._M_current =
         (Item *)std::
                 vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
                 ::end(readerResult);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    pIVar2 = __gnu_cxx::
             __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
             ::operator->(&local_40);
    if ((pIVar2->isFile & 1U) != 0) {
      pIVar2 = __gnu_cxx::
               __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
               ::operator->(&local_40);
      lVar3 = std::__cxx11::string::find((char *)&pIVar2->name,0x16f1f8);
      if (lVar3 != -1) {
        item = __gnu_cxx::
               __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
               ::operator*(&local_40);
        buildFile(&local_188,this,item,
                  (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)it._M_current,tmpOut,tmpVector);
        BaseParser::File::operator=(file,&local_188);
        BaseParser::File::~File(&local_188);
        *processed = *processed + 1;
        if ((file->isValid & 1U) != 0) {
          pIVar2 = __gnu_cxx::
                   __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
                   ::operator->(&local_40);
          std::__cxx11::string::operator=((string *)&file->rootPath,(string *)&pIVar2->dir);
          __end2 = std::
                   vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                   ::begin(&file->prepTypes);
          type.implements.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                        ::end(&file->prepTypes);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
                                             *)&type.implements.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
                bVar1) {
            pPVar4 = __gnu_cxx::
                     __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
                     ::operator*(&__end2);
            BaseParser::PreparedType::PreparedType((PreparedType *)&__range2_1,pPVar4);
            std::
            vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
            ::push_back(this->typesRegistryUnfiltered,(PreparedType *)&__range2_1);
            BaseParser::PreparedType::~PreparedType((PreparedType *)&__range2_1);
            __gnu_cxx::
            __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
            ::operator++(&__end2);
          }
          __end2_1 = std::
                     vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                     ::begin(&file->prepTypesMain);
          type_1.implements.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                        ::end(&file->prepTypesMain);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
                                     *)&type_1.implements.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
          {
            pPVar4 = __gnu_cxx::
                     __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
                     ::operator*(&__end2_1);
            BaseParser::PreparedType::PreparedType((PreparedType *)local_3c8,pPVar4);
            std::
            vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
            ::push_back(this->typesRegistryUnfiltered,(PreparedType *)local_3c8);
            BaseParser::PreparedType::~PreparedType((PreparedType *)local_3c8);
            __gnu_cxx::
            __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
            ::operator++(&__end2_1);
          }
          std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>::
          push_back(this->results,file);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<phpconvert::DirectoryReader::Item_*,_std::vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void ZendParser::buildFiles(File file, vector<string> tmpOut, int &processed,
                                vector<DirectoryReader::Item> *readerResult,
                                vector<pair<string, string> > &tmpOutPairs,
                                vector<string> &tmpVector) {
        vector<DirectoryReader::Item>::iterator it;
        for (it = readerResult->begin(); it != readerResult->end(); ++it) {
            if (!it->isFile ||
                it->name.find(PHP_EXT) == string::npos) { //@todo find php3 and all possible native built in extensions
                continue;
            }

            file = buildFile(&(*it), tmpOutPairs, tmpOut, tmpVector);
            processed++;
            if (!file.isValid) {
                continue;
            }
            file.rootPath = it->dir;
            for (PreparedType type: file.prepTypes) {
                typesRegistryUnfiltered->push_back(type);
            }
            for (PreparedType type: file.prepTypesMain) {
                typesRegistryUnfiltered->push_back(type);
            }
            results->push_back(file);
        }
    }